

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_argv(lua_State *L,int narg,ErrMsg em,...)

{
  lua_State *in_RCX;
  __va_list_tag *in_stack_00000048;
  char *in_stack_00000050;
  lua_State *in_stack_00000058;
  va_list argp;
  char *msg;
  char *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  
  lj_strfmt_pushvf(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  err_argmsg(in_RCX,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
}

Assistant:

LJ_NOINLINE void lj_err_argv(lua_State *L, int narg, ErrMsg em, ...)
{
  const char *msg;
  va_list argp;
  va_start(argp, em);
  msg = lj_strfmt_pushvf(L, err2msg(em), argp);
  va_end(argp);
  err_argmsg(L, narg, msg);
}